

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O0

shared_ptr<nigel::AstCondition> __thiscall
nigel::AST_Parser::splitMostRightExpr
          (AST_Parser *this,shared_ptr<nigel::AstExpr> *currLVal,
          shared_ptr<nigel::AstCombinationCondition> *cExpr,int priority)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  mapped_type *pmVar4;
  undefined4 in_register_0000000c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_R8D;
  shared_ptr<nigel::AstCondition> sVar5;
  undefined1 local_80 [35];
  byte local_5d;
  undefined1 local_50 [16];
  undefined1 local_40 [8];
  shared_ptr<nigel::AstCombinationCondition> clTerm;
  int priority_local;
  shared_ptr<nigel::AstCombinationCondition> *cExpr_local;
  shared_ptr<nigel::AstExpr> *currLVal_local;
  AST_Parser *this_local;
  
  clTerm.super___shared_ptr<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = in_R8D;
  std::shared_ptr<nigel::AstCombinationCondition>::shared_ptr
            ((shared_ptr<nigel::AstCombinationCondition> *)local_40,(nullptr_t)0x0);
  while( true ) {
    peVar2 = std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)cExpr);
    local_5d = 0;
    bVar1 = false;
    if (peVar2->type == combinationCondition) {
      std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 cExpr);
      AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_50);
      local_5d = 1;
      peVar3 = std::
               __shared_ptr_access<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_50);
      pmVar4 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                             *)(currLVal + 2),&peVar3->op);
      bVar1 = *pmVar4 < clTerm.
                        super___shared_ptr<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._4_4_;
    }
    if ((local_5d & 1) != 0) {
      std::shared_ptr<nigel::AstCombinationCondition>::~shared_ptr
                ((shared_ptr<nigel::AstCombinationCondition> *)local_50);
    }
    if (!bVar1) break;
    std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               cExpr);
    AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)(local_80 + 0x10));
    std::shared_ptr<nigel::AstCombinationCondition>::operator=
              ((shared_ptr<nigel::AstCombinationCondition> *)local_40,
               (shared_ptr<nigel::AstCombinationCondition> *)(local_80 + 0x10));
    std::shared_ptr<nigel::AstCombinationCondition>::~shared_ptr
              ((shared_ptr<nigel::AstCombinationCondition> *)(local_80 + 0x10));
    std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               cExpr);
    AstExpr::as<nigel::AstCombinationCondition>((AstExpr *)local_80);
    peVar3 = std::
             __shared_ptr_access<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_80);
    std::shared_ptr<nigel::AstExpr>::operator=((shared_ptr<nigel::AstExpr> *)cExpr,&peVar3->rVal);
    std::shared_ptr<nigel::AstCombinationCondition>::~shared_ptr
              ((shared_ptr<nigel::AstCombinationCondition> *)local_80);
  }
  bVar1 = std::operator!=((shared_ptr<nigel::AstCombinationCondition> *)local_40,(nullptr_t)0x0);
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::AstCombinationCondition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    std::shared_ptr<nigel::AstCondition>::operator=
              (&peVar3->rVal,
               (shared_ptr<nigel::AstCombinationCondition> *)CONCAT44(in_register_0000000c,priority)
              );
    std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               cExpr);
    AstExpr::as<nigel::AstCondition>((AstExpr *)this);
  }
  else {
    std::shared_ptr<nigel::AstExpr>::operator=
              (currLVal + 0xb,
               (shared_ptr<nigel::AstCombinationCondition> *)CONCAT44(in_register_0000000c,priority)
              );
    std::__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               cExpr);
    AstExpr::as<nigel::AstCondition>((AstExpr *)this);
  }
  std::shared_ptr<nigel::AstCombinationCondition>::~shared_ptr
            ((shared_ptr<nigel::AstCombinationCondition> *)local_40);
  sVar5.super___shared_ptr<nigel::AstCondition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<nigel::AstCondition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<nigel::AstCondition>)
         sVar5.super___shared_ptr<nigel::AstCondition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AstCondition> AST_Parser::splitMostRightExpr( std::shared_ptr<AstExpr> currLVal, std::shared_ptr<AstCombinationCondition> cExpr, int priority )
	{
		//Check if lValue is a term
		std::shared_ptr<AstCombinationCondition> clTerm = nullptr;
		while( currLVal->type == AstExpr::Type::combinationCondition && opPriority[currLVal->as<AstCombinationCondition>()->op] < priority )
		{//Check if lTerm has to be splitted up
			clTerm = currLVal->as<AstCombinationCondition>();
			currLVal = currLVal->as<AstCombinationCondition>()->rVal;
		}

		//Test for lTerm
		if( clTerm != nullptr )
		{//Min. 1 term was splitted up
			clTerm->rVal = cExpr;
			return currLVal->as<AstCondition>();
		}
		else
		{//LValue is a atomic astExpr
			lValue = cExpr;//Set as lValue
			return currLVal->as<AstCondition>();
		}
	}